

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

void ghc::filesystem::current_path(path *p,error_code *ec)

{
  pointer pcVar1;
  int iVar2;
  error_category *peVar3;
  int *piVar4;
  char *local_48 [2];
  char local_38 [16];
  
  peVar3 = (error_category *)std::_V2::system_category();
  ec->_M_value = 0;
  ec->_M_cat = peVar3;
  pcVar1 = (p->_path)._M_dataplus._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar1,pcVar1 + (p->_path)._M_string_length);
  iVar2 = chdir(local_48[0]);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  if (iVar2 == -1) {
    piVar4 = __errno_location();
    ec->_M_value = *piVar4;
    ec->_M_cat = peVar3;
  }
  return;
}

Assistant:

GHC_INLINE void current_path(const path& p, std::error_code& ec) noexcept
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    if (!::SetCurrentDirectoryW(GHC_NATIVEWP(p))) {
        ec = detail::make_system_error();
    }
#else
    if (::chdir(p.string().c_str()) == -1) {
        ec = detail::make_system_error();
    }
#endif
}